

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  _Bool _Var3;
  bc_trie_t *trie;
  char *pcVar4;
  undefined7 uVar9;
  size_t len;
  char **strv;
  size_t sVar5;
  long lVar6;
  bc_slist_t *pbVar7;
  bc_slist_t *l;
  bc_slist_t *sources;
  bc_trie_t *pbVar8;
  bc_slist_t *ast;
  FILE *__stream;
  uint8_t uVar10;
  ulong uVar11;
  int iVar12;
  uint8_t *str;
  ulong uVar13;
  ulong uVar14;
  _bc_slist_t *p_Var15;
  bc_error_t *err;
  size_t input_len;
  char *local_80;
  char *local_78;
  char *local_70;
  bc_slist_t *local_68;
  bc_error_t *local_50;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  setlocale(6,"");
  trie = bc_trie_new(free);
  pcVar4 = bc_strdup("0.20.1.29-b1ae");
  bc_trie_insert(trie,"BLOGC_VERSION",pcVar4);
  if ((uint)argc < 2) {
    l = (bc_slist_t *)0x0;
    local_68 = (bc_slist_t *)0x0;
    local_78 = (char *)0x0;
    local_70 = (char *)0x0;
    local_80 = (char *)0x0;
    bVar2 = false;
LAB_00102b23:
    sVar5 = bc_slist_length(l);
    if (sVar5 == 0) {
      main_cold_2();
    }
    else {
      sVar5 = bc_slist_length(l);
      if (sVar5 < 2) {
        _Var3 = false;
        goto LAB_00102b48;
      }
      main_cold_1();
    }
    iVar12 = 1;
    pbVar7 = (bc_slist_t *)0x0;
    goto LAB_00102cbd;
  }
  uVar14 = (ulong)argc;
  uVar13 = 1;
  bVar2 = false;
  local_40 = 0;
  local_48 = 0;
  local_80 = (char *)0x0;
  local_70 = (char *)0x0;
  local_78 = (char *)0x0;
  local_68 = (bc_slist_t *)0x0;
  l = (bc_slist_t *)0x0;
  do {
    pcVar4 = argv[uVar13];
    if (*pcVar4 != '-') {
      pcVar4 = bc_strdup(pcVar4);
      l = bc_slist_append(l,pcVar4);
      goto LAB_0010287e;
    }
    bVar1 = pcVar4[1];
    uVar9 = (undefined7)
            ((ulong)((long)&switchD_0010285a::switchdataD_0010a004 +
                    (long)(int)(&switchD_0010285a::switchdataD_0010a004)[bVar1 - 100]) >> 8);
    switch((uint)bVar1) {
    case 100:
      bVar2 = true;
      break;
    case 0x65:
      if (pcVar4[2] == '\0') {
        if (uVar13 + 1 < uVar14) {
          pcVar4 = bc_strdup(argv[uVar13 + 1]);
          local_68 = bc_slist_append(local_68,pcVar4);
          uVar13 = uVar13 + 1;
        }
      }
      else {
        pcVar4 = bc_strdup(pcVar4 + 2);
        local_68 = bc_slist_append(local_68,pcVar4);
      }
      break;
    case 0x66:
    case 0x67:
    case 0x6a:
    case 0x6b:
    case 0x6d:
    case 0x6e:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x75:
switchD_0010285a_caseD_66:
      main_cold_5();
      iVar12 = 1;
      goto LAB_00102e9d;
    case 0x68:
      pcVar4 = 
      "usage:\n    blogc [-h] [-v] [-d] [-i] [-l [-e SOURCE]] [-D KEY=VALUE ...] [-p KEY]\n          [-t TEMPLATE] [-o OUTPUT] [SOURCE ...] - A blog compiler.\n\npositional arguments:\n    SOURCE        source file(s)\n\noptional arguments:\n    -h            show this help message and exit\n    -v            show version and exit\n    -d            enable debug\n    -i            read list of source files from standard input\n    -l            build listing page, from multiple source files\n    -e SOURCE     source file with content for listing page. requires \'-l\'\n    -D KEY=VALUE  set global variable\n    -p KEY        show the value of a variable after source parsing and exit\n    -t TEMPLATE   template file\n    -o OUTPUT     output file"
      ;
      goto LAB_00102dc7;
    case 0x69:
      local_40 = CONCAT71(uVar9,1);
      break;
    case 0x6c:
      local_48 = CONCAT71(uVar9,1);
      break;
    case 0x6f:
      if (pcVar4[2] == '\0') {
        if (uVar13 + 1 < uVar14) {
          local_70 = bc_strdup(argv[uVar13 + 1]);
          uVar13 = uVar13 + 1;
        }
      }
      else {
        local_70 = bc_strdup(pcVar4 + 2);
      }
      break;
    case 0x70:
      if (pcVar4[2] == '\0') {
        if (uVar13 + 1 < uVar14) {
          local_78 = bc_strdup(argv[uVar13 + 1]);
          uVar13 = uVar13 + 1;
        }
      }
      else {
        local_78 = bc_strdup(pcVar4 + 2);
      }
      break;
    case 0x74:
      if (pcVar4[2] == '\0') {
        if (uVar13 + 1 < uVar14) {
          local_80 = bc_strdup(argv[uVar13 + 1]);
          uVar13 = uVar13 + 1;
        }
      }
      else {
        local_80 = bc_strdup(pcVar4 + 2);
      }
      break;
    case 0x76:
      pcVar4 = "blogc 0.20.1.29-b1ae";
LAB_00102dc7:
      puts(pcVar4);
LAB_00102dcf:
      iVar12 = 0;
LAB_00102e9d:
      pbVar7 = (bc_slist_t *)0x0;
      goto LAB_00102cbd;
    default:
      if (bVar1 != 0x44) goto switchD_0010285a_caseD_66;
      if (pcVar4[2] == '\0') {
        uVar11 = uVar13 + 1;
        if ((uVar14 <= uVar11) ||
           (str = (uint8_t *)argv[uVar13 + 1], uVar13 = uVar11, str == (uint8_t *)0x0)) break;
      }
      else {
        str = (uint8_t *)(pcVar4 + 2);
        uVar11 = uVar13;
      }
      len = strlen((char *)str);
      _Var3 = bc_utf8_validate(str,len);
      if (_Var3) {
        strv = bc_str_split((char *)str,'=',2);
        sVar5 = bc_strv_length(strv);
        if (sVar5 == 2) {
          str = (uint8_t *)*strv;
          uVar10 = *str;
          if (uVar10 != '\0') {
            lVar6 = 1;
            do {
              if (lVar6 == 1) {
                if (0x19 < (byte)(uVar10 + 0xbf)) {
                  pcVar4 = 
                  "blogc: error: invalid value for -D (first character in configuration key must be uppercase): %s\n"
                  ;
                  goto LAB_00102e83;
                }
              }
              else if ((0x19 < (byte)(uVar10 + 0xbf)) &&
                      (uVar10 != '_' && 9 < (byte)(uVar10 - 0x30))) {
                pcVar4 = 
                "blogc: error: invalid value for -D (configuration key must be uppercase with \'_\' and digits after first character): %s\n"
                ;
                goto LAB_00102e83;
              }
              uVar10 = str[lVar6];
              lVar6 = lVar6 + 1;
            } while (uVar10 != '\0');
          }
          pcVar4 = bc_strdup(strv[1]);
          bc_trie_insert(trie,(char *)str,pcVar4);
          bc_strv_free(strv);
          uVar13 = uVar11;
          break;
        }
        pcVar4 = "blogc: error: invalid value for -D (must have an \'=\'): %s\n";
LAB_00102e83:
        fprintf(_stderr,pcVar4,str);
        bc_strv_free(strv);
        iVar12 = 1;
        goto LAB_00102e9d;
      }
      fprintf(_stderr,"blogc: error: invalid value for -D (must be valid UTF-8 string): %s\n",str);
      goto LAB_00102dcf;
    }
LAB_0010287e:
    uVar13 = uVar13 + 1;
  } while (uVar13 < uVar14);
  if ((local_40 & 1) != 0) {
    pcVar4 = bc_stdin_read(&local_38);
    pbVar7 = blogc_filelist_parse(pcVar4,local_38);
    free(pcVar4);
    l = bc_slist_append_list(l,pbVar7);
  }
  _Var3 = true;
  if ((local_48 & 1) == 0) goto LAB_00102b23;
LAB_00102b48:
  local_50 = (bc_error_t *)0x0;
  sources = blogc_source_parse_from_files(trie,l,&local_50);
  if (local_50 == (bc_error_t *)0x0) {
    if ((local_68 != (bc_slist_t *)0x0 & _Var3) == 1) {
      pbVar7 = (bc_slist_t *)0x0;
      p_Var15 = local_68;
      do {
        if (*p_Var15->data == '\0') {
          pbVar8 = (bc_trie_t *)0x0;
        }
        else {
          pbVar8 = blogc_source_parse_from_file(trie,(char *)p_Var15->data,&local_50);
          if (local_50 != (bc_error_t *)0x0) {
            bc_error_print(local_50,"blogc");
            iVar12 = 1;
            goto LAB_00102c9f;
          }
        }
        pbVar7 = bc_slist_append(pbVar7,pbVar8);
        p_Var15 = p_Var15->next;
      } while (p_Var15 != (_bc_slist_t *)0x0);
    }
    else {
      pbVar7 = (bc_slist_t *)0x0;
    }
    if (local_78 == (char *)0x0) {
      if (local_80 == (char *)0x0) {
        main_cold_4();
        iVar12 = 1;
      }
      else {
        ast = blogc_template_parse_from_file(local_80,&local_50);
        if (local_50 == (bc_error_t *)0x0) {
          if (bVar2) {
            blogc_debug_template(ast);
          }
          pcVar4 = blogc_render(ast,sources,pbVar7,trie,_Var3);
          if ((local_70 == (char *)0x0) || ((*local_70 == '-' && (local_70[1] == '\0')))) {
            bVar2 = true;
            __stream = _stdout;
LAB_00102de2:
            if (pcVar4 != (char *)0x0) {
              fputs(pcVar4,__stream);
            }
            iVar12 = 0;
            if (!bVar2) {
              fclose(__stream);
            }
          }
          else {
            blogc_mkdir_recursive(local_70);
            __stream = fopen(local_70,"w");
            if (__stream != (FILE *)0x0) {
              bVar2 = false;
              goto LAB_00102de2;
            }
            main_cold_3();
            iVar12 = 1;
          }
          free(pcVar4);
        }
        else {
          bc_error_print(local_50,"blogc");
          iVar12 = 1;
        }
        blogc_template_free_ast(ast);
      }
      local_78 = (char *)0x0;
    }
    else {
      if (_Var3 == false && sources != (bc_slist_t *)0x0) {
        pbVar8 = (bc_trie_t *)sources->data;
      }
      else {
        pbVar8 = (bc_trie_t *)0x0;
      }
      iVar12 = 0;
      pcVar4 = blogc_format_variable(local_78,trie,pbVar8,(char *)0x0,(bc_slist_t *)0x0);
      if (pcVar4 == (char *)0x0) {
        fprintf(_stderr,"blogc: error: variable not found: %s\n",local_78);
        iVar12 = 0x4e;
      }
      else {
        puts(pcVar4);
      }
      free(pcVar4);
    }
  }
  else {
    bc_error_print(local_50,"blogc");
    iVar12 = 1;
    pbVar7 = (bc_slist_t *)0x0;
  }
LAB_00102c9f:
  bc_slist_free_full(sources,bc_trie_free);
  bc_error_free(local_50);
LAB_00102cbd:
  bc_trie_free(trie);
  free(local_80);
  free(local_70);
  free(local_78);
  bc_slist_free_full(local_68,free);
  bc_slist_free_full(pbVar7,bc_trie_free);
  bc_slist_free_full(l,free);
  return iVar12;
}

Assistant:

int
main(int argc, char **argv)
{
    setlocale(LC_ALL, "");

    int rv = 0;

#ifdef MAKE_EMBEDDED
    bool embedded = false;
#endif
    bool debug = false;
    bool input_stdin = false;
    bool listing = false;
    char *template = NULL;
    char *output = NULL;
    char *print = NULL;
    char *tmp = NULL;
    char **pieces = NULL;

    bc_slist_t *sources = NULL;
    bc_slist_t *listing_entries = NULL;
    bc_slist_t *listing_entries_source = NULL;
    bc_trie_t *config = bc_trie_new(free);
    bc_trie_insert(config, "BLOGC_VERSION", bc_strdup(PACKAGE_VERSION));

    for (size_t i = 1; i < argc; i++) {
        tmp = NULL;
        if (argv[i][0] == '-') {
            switch (argv[i][1]) {
                case 'h':
                    blogc_print_help();
                    goto cleanup;
                case 'v':
                    printf("blogc " PACKAGE_VERSION "\n");
                    goto cleanup;
                case 'd':
                    debug = true;
                    break;
                case 'i':
                    input_stdin = true;
                    break;
                case 'l':
                    listing = true;
                    break;
                case 'e':
                    if (argv[i][2] != '\0')
                        listing_entries = bc_slist_append(listing_entries, bc_strdup(argv[i] + 2));
                    else if (i + 1 < argc)
                        listing_entries = bc_slist_append(listing_entries, bc_strdup(argv[++i]));
                    break;
                case 't':
                    if (argv[i][2] != '\0')
                        template = bc_strdup(argv[i] + 2);
                    else if (i + 1 < argc)
                        template = bc_strdup(argv[++i]);
                    break;
                case 'o':
                    if (argv[i][2] != '\0')
                        output = bc_strdup(argv[i] + 2);
                    else if (i + 1 < argc)
                        output = bc_strdup(argv[++i]);
                    break;
                case 'p':
                    if (argv[i][2] != '\0')
                        print = bc_strdup(argv[i] + 2);
                    else if (i + 1 < argc)
                        print = bc_strdup(argv[++i]);
                    break;
                case 'D':
                    if (argv[i][2] != '\0')
                        tmp = argv[i] + 2;
                    else if (i + 1 < argc)
                        tmp = argv[++i];
                    if (tmp != NULL) {
                        if (!bc_utf8_validate((uint8_t*) tmp, strlen(tmp))) {
                            fprintf(stderr, "blogc: error: invalid value for "
                                "-D (must be valid UTF-8 string): %s\n", tmp);
                            goto cleanup;
                        }
                        pieces = bc_str_split(tmp, '=', 2);
                        if (bc_strv_length(pieces) != 2) {
                            fprintf(stderr, "blogc: error: invalid value for "
                                "-D (must have an '='): %s\n", tmp);
                            bc_strv_free(pieces);
                            rv = 1;
                            goto cleanup;
                        }
                        for (size_t j = 0; pieces[0][j] != '\0'; j++) {
                            char c = pieces[0][j];
                            if (j == 0) {
                                if (!(c >= 'A' && c <= 'Z')) {
                                    fprintf(stderr, "blogc: error: invalid value "
                                        "for -D (first character in configuration "
                                        "key must be uppercase): %s\n", pieces[0]);
                                    bc_strv_free(pieces);
                                    rv = 1;
                                    goto cleanup;
                                }
                                continue;
                            }
                            if (!((c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') || c == '_')) {
                                fprintf(stderr, "blogc: error: invalid value "
                                    "for -D (configuration key must be uppercase "
                                    "with '_' and digits after first character): %s\n",
                                    pieces[0]);
                                bc_strv_free(pieces);
                                rv = 1;
                                goto cleanup;
                            }
                        }
                        bc_trie_insert(config, pieces[0], bc_strdup(pieces[1]));
                        bc_strv_free(pieces);
                        pieces = NULL;
                    }
                    break;
#ifdef MAKE_EMBEDDED
                case 'm':
                    embedded = true;
                    break;
#endif
                default:
                    blogc_print_usage();
                    fprintf(stderr, "blogc: error: invalid argument: -%c\n",
                        argv[i][1]);
                    rv = 1;
                    goto cleanup;
            }
        }
        else {
            sources = bc_slist_append(sources, bc_strdup(argv[i]));
        }

#ifdef MAKE_EMBEDDED
        if (embedded) {
            rv = bm_main(argc, argv);
            goto cleanup;
        }
#endif

    }

    if (input_stdin) {
        size_t input_len;
        char *input = bc_stdin_read(&input_len);
        bc_slist_t *input_list = blogc_filelist_parse(input, input_len);
        free(input);
        sources = bc_slist_append_list(sources, input_list);
    }

    if (!listing && bc_slist_length(sources) == 0) {
        blogc_print_usage();
        fprintf(stderr, "blogc: error: one source file is required\n");
        rv = 1;
        goto cleanup;
    }

    if (!listing && bc_slist_length(sources) > 1) {
        blogc_print_usage();
        fprintf(stderr, "blogc: error: only one source file should be provided, "
            "if running without '-l'\n");
        rv = 1;
        goto cleanup;
    }

    bc_error_t *err = NULL;

    bc_slist_t *s = blogc_source_parse_from_files(config, sources, &err);
    if (err != NULL) {
        bc_error_print(err, "blogc");
        rv = 1;
        goto cleanup2;
    }

    if (listing) {
        for (bc_slist_t *tmp = listing_entries; tmp != NULL; tmp = tmp->next) {
            if (0 == strlen(tmp->data)) {
                listing_entries_source = bc_slist_append(listing_entries_source, NULL);
                continue;
            }
            bc_trie_t *e = blogc_source_parse_from_file(config, tmp->data, &err);
            if (err != NULL) {
                bc_error_print(err, "blogc");
                rv = 1;
                goto cleanup2;
            }
            listing_entries_source = bc_slist_append(listing_entries_source, e);
        }
    }

    if (print != NULL) {
        bc_trie_t *local = NULL;
        if (!listing && s != NULL) {
            local = s->data;
        }
        char *val = blogc_format_variable(print, config, local, NULL, NULL);
        if (val == NULL) {
            fprintf(stderr, "blogc: error: variable not found: %s\n",
                print);
            rv = EX_CONFIG;
        }
        else {
            printf("%s\n", val);
        }
        free(val);
        goto cleanup2;
    }

    if (template == NULL) {
        blogc_print_usage();
        fprintf(stderr, "blogc: error: argument -t is required when rendering content\n");
        rv = 1;
        goto cleanup2;
    }

    bc_slist_t* l = blogc_template_parse_from_file(template, &err);
    if (err != NULL) {
        bc_error_print(err, "blogc");
        rv = 1;
        goto cleanup3;
    }

    if (debug)
        blogc_debug_template(l);

    char *out = blogc_render(l, s, listing_entries_source, config, listing);

    bool write_to_stdout = (output == NULL || (0 == strcmp(output, "-")));

    FILE *fp = stdout;
    if (!write_to_stdout) {
        blogc_mkdir_recursive(output);
        fp = fopen(output, "w");
        if (fp == NULL) {
            fprintf(stderr, "blogc: error: failed to open output file (%s): %s\n",
                output, strerror(errno));
            rv = 1;
            goto cleanup4;
        }
    }

    if (out != NULL)
        fprintf(fp, "%s", out);

    if (!write_to_stdout)
        fclose(fp);

cleanup4:
    free(out);
cleanup3:
    blogc_template_free_ast(l);
cleanup2:
    bc_slist_free_full(s, (bc_free_func_t) bc_trie_free);
    bc_error_free(err);
cleanup:
    bc_trie_free(config);
    free(template);
    free(output);
    free(print);
    bc_slist_free_full(listing_entries, free);
    bc_slist_free_full(listing_entries_source, (bc_free_func_t) bc_trie_free);
    bc_slist_free_full(sources, free);
    return rv;
}